

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

QString * __thiscall
QTextHtmlExporter::findUrlForImage
          (QTextHtmlExporter *this,QTextDocument *doc,qint64 cacheKey,bool isPixmap)

{
  bool bVar1;
  int iVar2;
  QTextDocument *pQVar3;
  QImage *pQVar4;
  QImage *in_RCX;
  QTextHtmlExporter *in_RDX;
  QString *in_RDI;
  undefined1 in_R8B;
  long in_FS_OFFSET;
  QVariant *v;
  QTextDocumentPrivate *priv;
  QTextDocument *parent;
  const_iterator it;
  QString url;
  QPixmap *in_stack_fffffffffffffef8;
  QImage *in_stack_ffffffffffffff00;
  QImage *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff50;
  undefined3 in_stack_ffffffffffffff54;
  uint uVar5;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_84;
  undefined1 local_80 [24];
  const_iterator local_68;
  QImage local_48;
  const_iterator local_30;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = CONCAT13(in_R8B,in_stack_ffffffffffffff54) & 0x1ffffff;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x7b923a);
  if (in_RDX == (QTextHtmlExporter *)0x0) {
    QString::QString((QString *)in_stack_ffffffffffffff00,(QString *)in_stack_fffffffffffffef8);
  }
  else {
    QObject::parent((QObject *)0x7b926b);
    pQVar3 = qobject_cast<QTextDocument*>((QObject *)0x7b9273);
    if (pQVar3 == (QTextDocument *)0x0) {
      QTextDocumentPrivate::get((QTextDocument *)0x7b92ba);
      local_28._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
      local_28._M_node =
           (_Base_ptr)
           QMap<QUrl,_QVariant>::constBegin((QMap<QUrl,_QVariant> *)in_stack_fffffffffffffef8);
      while( true ) {
        local_30._M_node =
             (_Base_ptr)
             QMap<QUrl,_QVariant>::constEnd((QMap<QUrl,_QVariant> *)in_stack_fffffffffffffef8);
        bVar1 = ::operator!=((const_iterator *)in_stack_ffffffffffffff00,
                             (const_iterator *)in_stack_fffffffffffffef8);
        if (!bVar1) break;
        QMap<QUrl,_QVariant>::const_iterator::value((const_iterator *)0x7b933a);
        iVar2 = ::QVariant::userType((QVariant *)0x7b9349);
        if ((iVar2 == 0x1006) && ((uVar5 & 0x1000000) == 0)) {
          qvariant_cast<QImage>((QVariant *)in_stack_ffffffffffffff18);
          in_stack_ffffffffffffff18 = (QImage *)QImage::cacheKey(&local_48);
          pQVar4 = in_RCX;
          QImage::~QImage(in_stack_ffffffffffffff00);
          bVar1 = in_stack_ffffffffffffff18 == in_RCX;
          in_RCX = pQVar4;
          if (bVar1) break;
        }
        iVar2 = ::QVariant::userType((QVariant *)0x7b93af);
        if ((iVar2 == 0x1001) && ((uVar5 & 0x1000000) != 0)) {
          qvariant_cast<QPixmap>((QVariant *)in_stack_ffffffffffffff18);
          in_stack_ffffffffffffff00 = in_RCX;
          pQVar4 = (QImage *)QPixmap::cacheKey(in_stack_fffffffffffffef8);
          in_RCX = in_stack_ffffffffffffff00;
          QPixmap::~QPixmap((QPixmap *)in_stack_ffffffffffffff00);
          if (pQVar4 == in_stack_ffffffffffffff00) break;
        }
        QMap<QUrl,_QVariant>::const_iterator::operator++
                  ((const_iterator *)in_stack_ffffffffffffff00);
      }
      local_68._M_node =
           (_Base_ptr)
           QMap<QUrl,_QVariant>::constEnd((QMap<QUrl,_QVariant> *)in_stack_fffffffffffffef8);
      bVar1 = ::operator!=((const_iterator *)in_stack_ffffffffffffff00,
                           (const_iterator *)in_stack_fffffffffffffef8);
      if (bVar1) {
        in_stack_fffffffffffffef8 =
             (QPixmap *)QMap<QUrl,_QVariant>::const_iterator::key((const_iterator *)0x7b9460);
        QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                  (&local_84,PrettyDecoded);
        QUrl::toString((QUrlTwoFlags *)local_80);
        QString::operator=((QString *)in_stack_ffffffffffffff00,(QString *)in_stack_fffffffffffffef8
                          );
        QString::~QString((QString *)0x7b94ad);
      }
      QString::QString((QString *)in_stack_ffffffffffffff00,(QString *)in_stack_fffffffffffffef8);
    }
    else {
      findUrlForImage(in_RDX,(QTextDocument *)in_RCX,CONCAT44(uVar5,in_stack_ffffffffffffff50),
                      SUB81((ulong)pQVar3 >> 0x38,0));
    }
  }
  QString::~QString((QString *)0x7b94d4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QTextHtmlExporter::findUrlForImage(const QTextDocument *doc, qint64 cacheKey, bool isPixmap)
{
    QString url;
    if (!doc)
        return url;

    if (QTextDocument *parent = qobject_cast<QTextDocument *>(doc->parent()))
        return findUrlForImage(parent, cacheKey, isPixmap);

    const QTextDocumentPrivate *priv = QTextDocumentPrivate::get(doc);
    Q_ASSERT(priv != nullptr);

    QMap<QUrl, QVariant>::const_iterator it = priv->cachedResources.constBegin();
    for (; it != priv->cachedResources.constEnd(); ++it) {

        const QVariant &v = it.value();
        if (v.userType() == QMetaType::QImage && !isPixmap) {
            if (qvariant_cast<QImage>(v).cacheKey() == cacheKey)
                break;
        }

        if (v.userType() == QMetaType::QPixmap && isPixmap) {
            if (qvariant_cast<QPixmap>(v).cacheKey() == cacheKey)
                break;
        }
    }

    if (it != priv->cachedResources.constEnd())
        url = it.key().toString();

    return url;
}